

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiTabItem *pIVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  ImGuiIO *pIVar5;
  ImGuiIO *pIVar6;
  char *label_00;
  ulong uVar7;
  bool bVar8;
  ImS8 IVar9;
  ImU32 id;
  ImU32 IVar10;
  ImGuiID IVar11;
  ulong uVar12;
  ImGuiTabItem *pIVar13;
  size_t sVar14;
  char *pcVar15;
  int iVar16;
  ImGuiTabItemFlags flags_00;
  uint uVar17;
  int iVar18;
  ImGuiContext *pIVar19;
  ImGuiCol idx;
  ulong uVar20;
  ImGuiContext *pIVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar25;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_98;
  ImVec2 local_88;
  ImGuiContext *local_80;
  uint local_78;
  uint local_74;
  ImVec2 local_70;
  bool *local_68;
  ImGuiContext *local_60;
  ImVec2 local_58;
  int local_4c;
  undefined1 local_48 [16];
  char *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar19 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    local_98.Min.x = 3.4028235e+38;
    local_98.Min.y = 3.4028235e+38;
    local_98.Max.x = -3.4028235e+38;
    local_98.Max.y = -3.4028235e+38;
    ItemAdd(&local_98,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_60 = pIVar19;
  IVar4 = TabItemCalcSize(label,p_open != (bool *)0x0);
  fVar23 = IVar4.x;
  if (id == 0) {
LAB_001583de:
    pIVar19 = (ImGuiContext *)0x0;
  }
  else {
    uVar12 = (ulong)(tab_bar->Tabs).Size;
    bVar22 = 0 < (long)uVar12;
    if (0 < (long)uVar12) {
      pIVar19 = (ImGuiContext *)(tab_bar->Tabs).Data;
      bVar22 = true;
      IVar10._0_1_ = pIVar19->Initialized;
      IVar10._1_1_ = pIVar19->FrameScopeActive;
      IVar10._2_1_ = pIVar19->FrameScopePushedImplicitWindow;
      IVar10._3_1_ = pIVar19->FontAtlasOwnedByContext;
      if (IVar10 != id) {
        pIVar5 = &pIVar19->IO;
        uVar7 = 1;
        pIVar21 = pIVar19;
        do {
          uVar20 = uVar7;
          pIVar19 = (ImGuiContext *)(pIVar5->KeyMap + uVar12 * 8 + -0x17);
          if (uVar12 == uVar20) break;
          pIVar19 = (ImGuiContext *)&(pIVar21->IO).IniFilename;
          pIVar6 = &pIVar21->IO;
          uVar7 = uVar20 + 1;
          pIVar21 = pIVar19;
        } while (*(ImU32 *)&pIVar6->IniFilename != id);
        bVar22 = uVar20 < uVar12;
      }
    }
    if (!bVar22) goto LAB_001583de;
  }
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = IVar4.x;
  local_48._4_4_ = IVar4.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  local_80 = pIVar19;
  local_68 = p_open;
  if (pIVar19 == (ImGuiContext *)0x0) {
    iVar18 = (tab_bar->Tabs).Size;
    iVar2 = (tab_bar->Tabs).Capacity;
    if (iVar18 == iVar2) {
      iVar18 = iVar18 + 1;
      if (iVar2 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar2 / 2 + iVar2;
      }
      if (iVar18 < iVar16) {
        iVar18 = iVar16;
      }
      if (iVar2 < iVar18) {
        pIVar13 = (ImGuiTabItem *)MemAlloc((long)iVar18 << 5);
        pIVar3 = (tab_bar->Tabs).Data;
        if (pIVar3 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar13,pIVar3,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar13;
        (tab_bar->Tabs).Capacity = iVar18;
        fVar23 = (float)local_48._0_4_;
      }
    }
    pIVar13 = (tab_bar->Tabs).Data;
    iVar18 = (tab_bar->Tabs).Size;
    pIVar3 = pIVar13 + iVar18;
    pIVar3->ID = 0;
    pIVar3->Flags = 0;
    pIVar3->LastFrameVisible = -1;
    pIVar3->LastFrameSelected = -1;
    pIVar13[iVar18].NameOffset = -1;
    pIVar13[iVar18].Offset = 0.0;
    pIVar13[iVar18].Width = 0.0;
    pIVar13[iVar18].WidthContents = 0.0;
    iVar18 = (tab_bar->Tabs).Size;
    uVar17 = iVar18 + 1;
    (tab_bar->Tabs).Size = uVar17;
    if (iVar18 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                    ,0x4f0,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar3 = (tab_bar->Tabs).Data;
    local_80 = (ImGuiContext *)(pIVar3 + ((ulong)uVar17 - 1));
    local_80->Initialized = (bool)(char)id;
    local_80->FrameScopeActive = (bool)(char)(id >> 8);
    local_80->FrameScopePushedImplicitWindow = (bool)(char)(id >> 0x10);
    local_80->FontAtlasOwnedByContext = (bool)(char)(id >> 0x18);
    pIVar3[(ulong)uVar17 - 1].Width = fVar23;
  }
  pIVar21 = (ImGuiContext *)(tab_bar->Tabs).Data;
  local_38 = label;
  if ((local_80 < pIVar21) ||
     ((ImGuiContext *)((pIVar21->IO).KeyMap + (long)(tab_bar->Tabs).Size * 8 + -0xf) <= local_80)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                  ,0x506,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)local_80 - (int)pIVar21) >> 5);
  local_74 = flags | 0x100000;
  if (local_68 != (bool *)0x0) {
    local_74 = flags;
  }
  (local_80->IO).IniSavingRate = fVar23;
  local_78 = tab_bar->Flags;
  local_88.x = (float)(tab_bar->PrevFrameVisible + 1);
  iVar18 = local_60->FrameCount;
  iVar16 = (local_80->IO).ConfigFlags + 1;
  (local_80->IO).ConfigFlags = iVar18;
  *(uint *)&local_80->field_0x4 = local_74;
  iVar2 = (tab_bar->TabsNames).Buf.Size;
  fVar23 = (float)(iVar2 + -1);
  if (iVar2 == 0) {
    fVar23 = 0.0;
  }
  (local_80->IO).DisplaySize.x = fVar23;
  sVar14 = strlen(label);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar14 + 1);
  pIVar21 = local_60;
  if (iVar16 < iVar18) {
    if ((((tab_bar->Flags & 2U) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar18 <= (int)local_88.x || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((tab_bar->Flags & 1U) == 0) {
    fVar23 = tab_bar->OffsetNextTab;
    (local_80->IO).DisplaySize.y = fVar23;
    tab_bar->OffsetNextTab =
         (local_80->IO).DeltaTime + (local_60->Style).ItemInnerSpacing.x + fVar23;
  }
  if (((local_74 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar22 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_88.x < iVar18) && ((tab_bar->Tabs).Size == 1))
  {
    bVar22 = (tab_bar->Flags & 2) == 0;
  }
  else {
    bVar22 = false;
  }
  if ((iVar16 < iVar18) && (pIVar19 == (ImGuiContext *)0x0 || iVar18 <= (int)local_88.x)) {
    PushItemFlag(0x18,true);
    local_98.Min.x = 3.4028235e+38;
    local_98.Min.y = 3.4028235e+38;
    local_98.Max.x = -3.4028235e+38;
    local_98.Max.y = -3.4028235e+38;
    ItemAdd(&local_98,id,(ImRect *)0x0);
    PopItemFlag();
    return bVar22;
  }
  if (tab_bar->SelectedTabId == id) {
    (local_80->IO).BackendFlags = local_60->FrameCount;
  }
  fVar24 = (float)(int)((local_80->IO).DisplaySize.y - tab_bar->ScrollingAnim) +
           (tab_bar->BarRect).Min.x;
  fVar25 = (tab_bar->BarRect).Min.y + 0.0;
  local_88 = (this->DC).CursorPos;
  local_98.Max.x = fVar24 + (local_80->IO).DeltaTime;
  local_98.Min.y = fVar25;
  local_98.Min.x = fVar24;
  (this->DC).CursorPos = local_98.Min;
  local_98.Max.y = (float)local_48._4_4_ + fVar25;
  fVar23 = (tab_bar->BarRect).Min.x;
  bVar8 = true;
  if (fVar23 <= fVar24) {
    pIVar1 = &(tab_bar->BarRect).Max;
    bVar8 = pIVar1->x <= local_98.Max.x && local_98.Max.x != pIVar1->x;
  }
  local_48[0] = bVar8;
  local_4c = iVar18;
  if (bVar8 != false) {
    local_58.y = fVar25 + -1.0;
    local_58.x = (float)(~-(uint)(fVar23 <= fVar24) & (uint)fVar23 |
                        (uint)fVar24 & -(uint)(fVar23 <= fVar24));
    local_70.x = (tab_bar->BarRect).Max.x;
    local_70.y = local_98.Max.y;
    PushClipRect(&local_58,&local_70,true);
  }
  IVar4 = (this->DC).CursorMaxPos;
  local_58.y = local_98.Max.y - local_98.Min.y;
  local_58.x = local_98.Max.x - local_98.Min.x;
  ItemSize(&local_58,(pIVar21->Style).FramePadding.y);
  (this->DC).CursorMaxPos = IVar4;
  bVar8 = ItemAdd(&local_98,id,(ImRect *)0x0);
  if (!bVar8) {
    if (local_48[0] != '\0') {
      PopClipRect();
    }
    (this->DC).CursorPos = local_88;
    return bVar22;
  }
  bVar8 = ButtonBehavior(&local_98,id,(bool *)&local_58,(bool *)&local_70,
                         (uint)pIVar21->DragDropActive << 0xc | 0x44);
  label_00 = local_38;
  if (bVar8) {
    tab_bar->NextSelectedTabId = id;
  }
  local_58.x._0_1_ = local_58.x._0_1_ | pIVar21->HoveredId == id;
  if (local_70.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  if ((((local_70.x._0_1_ == '\x01') && (local_4c <= iVar16)) &&
      (bVar8 = IsMouseDragging(0,-1.0), bVar8)) &&
     ((pIVar21->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar23 = (pIVar21->IO).MouseDelta.x;
    if ((0.0 <= fVar23) ||
       (pIVar1 = &(pIVar21->IO).MousePos, local_98.Min.x < pIVar1->x || local_98.Min.x == pIVar1->x)
       ) {
      if ((fVar23 <= 0.0) || ((pIVar21->IO).MousePos.x <= local_98.Max.x)) goto LAB_001588c4;
      IVar9 = '\x01';
    }
    else {
      IVar9 = -1;
    }
    if (tab_bar->ReorderRequestTabId != 0) {
      __assert_fail("tab_bar->ReorderRequestTabId == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_widgets.cpp"
                    ,0x1a57,
                    "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                   );
    }
    tab_bar->ReorderRequestTabId = *(ImGuiID *)local_80;
    tab_bar->ReorderRequestDir = IVar9;
  }
LAB_001588c4:
  draw_list = this->DrawList;
  idx = 0x22;
  if ((local_70.x._0_1_ == '\0') && (local_58.x._0_1_ == '\0')) {
    if (bVar22 == false) {
      idx = (uint)((local_78 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_78 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  IVar10 = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_98,flags_00,IVar10);
  RenderNavHighlight(&local_98,id,1);
  bVar8 = IsItemHovered(8);
  if ((bVar8) && ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar17 = (uint)tab_bar->Flags >> 1 & 4 | local_74;
  if (local_68 == (bool *)0x0) {
    IVar11 = 0;
  }
  else {
    IVar11 = ImGuiWindow::GetID(this,(void *)((ulong)id + 1));
  }
  bVar8 = TabItemLabelAndCloseButton
                    (draw_list,&local_98,uVar17,tab_bar->FramePadding,label_00,id,IVar11);
  if ((local_68 != (bool *)0x0) && (bVar8)) {
    *local_68 = false;
    IVar11._0_1_ = local_80->Initialized;
    IVar11._1_1_ = local_80->FrameScopeActive;
    IVar11._2_1_ = local_80->FrameScopePushedImplicitWindow;
    IVar11._3_1_ = local_80->FontAtlasOwnedByContext;
    if (tab_bar->VisibleTabId == IVar11) {
      if ((*(uint *)&local_80->field_0x4 & 1) == 0) {
        (local_80->IO).ConfigFlags = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if ((*(uint *)&local_80->field_0x4 & 1) != 0) {
      tab_bar->NextSelectedTabId = IVar11;
    }
  }
  if (local_48[0] != '\0') {
    PopClipRect();
  }
  (this->DC).CursorPos = local_88;
  if ((((local_60->HoveredId == id) && (local_70.x._0_1_ == '\0')) &&
      (0.5 < local_60->HoveredIdNotActiveTimer)) &&
     ((bVar8 = IsItemHovered(0), bVar8 && ((tab_bar->Flags & 0x20) == 0)))) {
    pcVar15 = FindRenderedTextEnd(label_00,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)label_00),label_00);
  }
  return bVar22;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}